

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O0

size_t lj_utils_read_uleb128_n(uint64_t *out,uint8_t *buffer,size_t n)

{
  byte *pbVar1;
  size_t sVar2;
  size_t n_local;
  uint8_t *buffer_local;
  uint64_t *out_local;
  uint8_t octet;
  uint64_t shift;
  uint64_t value;
  size_t i;
  
  i = 0;
  value = 0;
  shift = 0;
  while ((n == 0 || (i + 1 <= n))) {
    sVar2 = i + 1;
    pbVar1 = buffer + i;
    value = (long)(int)(*pbVar1 & 0x7f) << ((byte)shift & 0x3f) | value;
    shift = shift + 7;
    i = sVar2;
    if ((*pbVar1 & 0x80) == 0) {
      *out = value;
      return sVar2;
    }
  }
  return 0;
}

Assistant:

size_t LJ_FASTCALL lj_utils_read_uleb128_n(uint64_t *out, const uint8_t *buffer,
					   size_t n)
{
  return _read_uleb128(out, buffer, n);
}